

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O1

UINT8 device_start_c140(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ushort uVar4;
  UINT8 UVar5;
  c140_state *info;
  DEV_DATA DVar6;
  byte bVar7;
  sbyte sVar8;
  ushort uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  DVar6.chipInf = calloc(1,0x788);
  if (DVar6.chipInf == (void *)0x0) {
    UVar5 = 0xff;
  }
  else {
    uVar1 = cfg->clock;
    *(uint *)&((DEV_DATA *)((long)DVar6.chipInf + 8))->chipInf = uVar1;
    *(uint *)((long)DVar6.chipInf + 0xc) = uVar1 / 0x120;
    if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (uVar1 / 0x120 < cfg->smplRate)))) {
      *(UINT32 *)((long)DVar6.chipInf + 0xc) = cfg->smplRate;
    }
    uVar2 = *(uint *)((long)DVar6.chipInf + 0xc);
    *(float *)&((DEV_DATA *)((long)DVar6.chipInf + 0x10))->chipInf =
         ((float)uVar1 / 288.0) / (float)uVar2;
    *(UINT8 *)((long)DVar6.chipInf + 0x14) = cfg->flags;
    *(undefined4 *)&((DEV_DATA *)((long)DVar6.chipInf + 0x18))->chipInf = 0;
    ((DEV_DATA *)((long)DVar6.chipInf + 0x20))->chipInf = (void *)0x0;
    iVar11 = 0;
    uVar12 = 0;
    do {
      bVar7 = (byte)uVar12 & 7;
      iVar13 = iVar11 >> 0x1b;
      iVar3 = -iVar13;
      if (0 < iVar13) {
        iVar3 = iVar13;
      }
      sVar8 = bVar7 + 3;
      if ((uVar12 & 7) == 0) {
        sVar8 = 4;
      }
      uVar4 = (short)(iVar3 << sVar8) + ((ushort)(0x80 << bVar7) & 0x7f00);
      uVar9 = -(uVar4 & 0xfffe);
      if (uVar12 < 0x80) {
        uVar9 = uVar4;
      }
      *(ushort *)((long)DVar6.chipInf + uVar12 * 2 + 0x228) = uVar9;
      uVar12 = uVar12 + 1;
      iVar11 = iVar11 + 0x1000000;
    } while (uVar12 != 0x100);
    lVar10 = 0x449;
    do {
      *(undefined1 *)((long)DVar6.chipInf + lVar10) = 0;
      lVar10 = lVar10 + 0x24;
    } while (lVar10 != 0x7a9);
    *(void **)DVar6.chipInf = DVar6.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar6.chipInf;
    retDevInf->sampleRate = uVar2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar5 = '\0';
  }
  return UVar5;
}

Assistant:

static UINT8 device_start_c140(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	c140_state *info;
	int i;

	info = (c140_state *)calloc(1, sizeof(c140_state));
	if (info == NULL)
		return 0xFF;
	
	info->clock = cfg->clock;
	info->sample_rate = info->clock / 288;	// sample rate according to superctr
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->sample_rate, cfg->smplRate);
	info->pbase = (float)info->clock / 288.0f / (float)info->sample_rate;

	info->banking_type = cfg->flags;

	info->pRomSize = 0x00;
	info->pRom = NULL;

	for(i = 0; i < 256; i++)
	{
		UINT8 s1 = i & 7;
		UINT8 s2 = abs((INT8)i >> 3) & 0x1F;
		info->mulaw_table[i]  = (0x80 << s1) & 0xFF00;
		info->mulaw_table[i] += s2 << (s1 ? (s1+3) : 4);
		if (i & 0x80)
			info->mulaw_table[i] = -info->mulaw_table[i];
	}

	c140_set_mute_mask(info, 0x000000);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->sample_rate, &devDef);
	return 0x00;
}